

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::describingcomptype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  HeapType HVar2;
  bool bVar3;
  string_view expected;
  optional<wasm::HeapType> desc;
  undefined1 local_b8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> x;
  long local_80;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val;
  
  this = &ctx->in;
  expected._M_str = "describes";
  expected._M_len = 9;
  bVar3 = Lexer::takeSExprStart(this,expected);
  if (bVar3) {
    typeidx<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)local_b8,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_50,
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_b8);
    if (_val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50,
                 (undefined1 *)
                 ((long)_val.val.
                        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                        ._M_u._M_first._M_storage.type.id + (long)local_50));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_70 == &local_60) {
        *puVar1 = local_60;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_58;
      }
      else {
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_70;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_60;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_68;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_50);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_50);
      desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
      desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)local_b8;
      TypeBuilder::setDescribed(ctx->builder,(ulong)ctx->index,desc);
      describedcomptype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Ok> *)local_50,ctx);
      if (_val.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          ._M_u._24_1_ == '\x01') {
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_50,
                   (undefined1 *)
                   ((long)_val.val.
                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          ._M_u._M_first._M_storage.type.id + (long)local_50));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_70 == &local_60) {
          *puVar1 = local_60;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_58;
        }
        else {
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_70;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_60;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_68;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_50);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_50);
        bVar3 = Lexer::takeRParen(this);
        if (bVar3) {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        }
        else {
          x.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          ._32_8_ = &stack0xffffffffffffff80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     ((long)&x.val.
                             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                     + 0x20),"expected end of describing type","");
          Lexer::err((Err *)local_50,this,
                     (string *)
                     ((long)&x.val.
                             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                     + 0x20));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
          HVar2.id = (long)&_val.val.
                            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                     + 8;
          if (local_50 == (undefined1  [8])HVar2.id) {
            *puVar1 = CONCAT71(_val.val.
                               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               ._M_u._9_7_,
                               _val.val.
                               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                               ._M_u._M_first._M_storage.exactness._0_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                 _val.val.
                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 ._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_50;
            *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>
                              .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
                 CONCAT71(_val.val.
                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          ._M_u._9_7_,
                          _val.val.
                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          ._M_u._M_first._M_storage.exactness._0_1_);
          }
          ((HeapType *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->id =
               (uintptr_t)
               _val.val.
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               ._M_u._M_first._M_storage.type.id;
          _val.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          ._M_u._M_first._M_storage.type.id = (HeapType)0;
          _val.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          ._M_u._M_first._M_storage.exactness._0_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
          local_50 = (undefined1  [8])HVar2;
          if ((long *)x.val.
                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                      ._32_8_ != &stack0xffffffffffffff80) {
            operator_delete((void *)x.val.
                                    super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    ._32_8_,local_80 + 1);
          }
        }
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_b8);
  }
  else {
    describedcomptype<wasm::WATParser::ParseTypeDefsCtx>(__return_storage_ptr__,ctx);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> describingcomptype(Ctx& ctx) {
  if (ctx.in.takeSExprStart("describes"sv)) {
    auto x = typeidx(ctx);
    CHECK_ERR(x);
    ctx.setDescribes(*x);
    CHECK_ERR(describedcomptype(ctx));
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of describing type");
    }
    return Ok{};
  }
  return describedcomptype(ctx);
}